

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O1

void __thiscall
agge::tests::VectorRasterizerTests::SubPixelLineExpandsMargins(VectorRasterizerTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  int iVar4;
  FailedAssertion *pFVar5;
  vector_rasterizer vr1;
  vector_rasterizer vr2;
  string local_188;
  string local_168;
  LocationInfo local_148;
  vector_rasterizer local_120;
  vector_rasterizer local_a8;
  
  vector_rasterizer::vector_rasterizer(&local_120);
  vector_rasterizer::vector_rasterizer(&local_a8);
  vector_rasterizer::line(&local_120,0xd00,0x1100,0xd80,0x11b3);
  vector_rasterizer::line(&local_a8,-0x171a,-0x2500,-0x1800,-0x24b3);
  iVar4 = local_120._max_y;
  iVar3 = local_120._min_y;
  paVar1 = &local_188.field_2;
  local_188._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_188,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_148,&local_188,0x57);
  if ((iVar4 < iVar3) || (local_120._max_x != local_120._min_x)) {
    pFVar5 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Values are not equal!","")
    ;
    ut::FailedAssertion::FailedAssertion(pFVar5,&local_168,&local_148);
    __cxa_throw(pFVar5,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  paVar2 = &local_148.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_148.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar1) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  iVar3 = local_120._min_y;
  local_188._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_188,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_148,&local_188,0x58);
  if (iVar3 != 0x11) {
    pFVar5 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Values are not equal!","")
    ;
    ut::FailedAssertion::FailedAssertion(pFVar5,&local_168,&local_148);
    __cxa_throw(pFVar5,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_148.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar1) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  iVar4 = local_120._max_y;
  iVar3 = local_120._min_y;
  local_188._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_188,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_148,&local_188,0x59);
  if (iVar4 != iVar3) {
    pFVar5 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Values are not equal!","")
    ;
    ut::FailedAssertion::FailedAssertion(pFVar5,&local_168,&local_148);
    __cxa_throw(pFVar5,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_148.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar1) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  local_188._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_188,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_148,&local_188,0x5a);
  if (local_120._min_y <= local_120._max_y) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148.filename._M_dataplus._M_p != paVar2) {
      operator_delete(local_148.filename._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != paVar1) {
      operator_delete(local_188._M_dataplus._M_p);
    }
    iVar4 = local_a8._max_y;
    iVar3 = local_a8._min_y;
    local_188._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
               ,"");
    ut::LocationInfo::LocationInfo(&local_148,&local_188,0x5c);
    if ((iVar4 < iVar3) || (local_a8._max_x != local_a8._min_x)) {
      pFVar5 = (FailedAssertion *)__cxa_allocate_exception(0x38);
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_168,"Values are not equal!","");
      ut::FailedAssertion::FailedAssertion(pFVar5,&local_168,&local_148);
      __cxa_throw(pFVar5,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148.filename._M_dataplus._M_p != paVar2) {
      operator_delete(local_148.filename._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != paVar1) {
      operator_delete(local_188._M_dataplus._M_p);
    }
    iVar3 = local_a8._min_y;
    local_188._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
               ,"");
    ut::LocationInfo::LocationInfo(&local_148,&local_188,0x5d);
    if (iVar3 == -0x25) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148.filename._M_dataplus._M_p != paVar2) {
        operator_delete(local_148.filename._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != paVar1) {
        operator_delete(local_188._M_dataplus._M_p);
      }
      local_188._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_188,
                 "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
                 ,"");
      ut::LocationInfo::LocationInfo(&local_148,&local_188,0x5e);
      if (local_a8._max_y == local_a8._min_y) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148.filename._M_dataplus._M_p != paVar2) {
          operator_delete(local_148.filename._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != paVar1) {
          operator_delete(local_188._M_dataplus._M_p);
        }
        if (local_a8._x_sorted_cells._begin != (cell *)0x0) {
          operator_delete__(local_a8._x_sorted_cells._begin);
        }
        if (local_a8._histogram_x._begin != (uint *)0x0) {
          operator_delete__(local_a8._histogram_x._begin);
        }
        if (local_a8._histogram_y._begin != (uint *)0x0) {
          operator_delete__(local_a8._histogram_y._begin);
        }
        if (local_a8._cells._begin != (cell *)0x0) {
          operator_delete__(local_a8._cells._begin);
        }
        if (local_120._x_sorted_cells._begin != (cell *)0x0) {
          operator_delete__(local_120._x_sorted_cells._begin);
        }
        if (local_120._histogram_x._begin != (uint *)0x0) {
          operator_delete__(local_120._histogram_x._begin);
        }
        if (local_120._histogram_y._begin != (uint *)0x0) {
          operator_delete__(local_120._histogram_y._begin);
        }
        if (local_120._cells._begin != (cell *)0x0) {
          operator_delete__(local_120._cells._begin);
        }
        return;
      }
      pFVar5 = (FailedAssertion *)__cxa_allocate_exception(0x38);
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_168,"Values are not equal!","");
      ut::FailedAssertion::FailedAssertion(pFVar5,&local_168,&local_148);
      __cxa_throw(pFVar5,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
    }
    pFVar5 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Values are not equal!","")
    ;
    ut::FailedAssertion::FailedAssertion(pFVar5,&local_168,&local_148);
    __cxa_throw(pFVar5,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  pFVar5 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Value is not \'false\'!","")
  ;
  ut::FailedAssertion::FailedAssertion(pFVar5,&local_168,&local_148);
  __cxa_throw(pFVar5,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
}

Assistant:

test( SubPixelLineExpandsMargins )
			{
				// INIT
				vector_rasterizer vr1, vr2;

				// ACT
				vr1.line(fp(13.0), fp(17.0), fp(13.5), fp(17.7));
				vr2.line(fp(-23.1), fp(-37.0), fp(-24.0), fp(-36.7));

				// ACT / ASSERT
				assert_equal(1, vr1.width());
				assert_equal(17, vr1.min_y());
				assert_equal(1, vr1.height());
				assert_is_false(vr1.empty());

				assert_equal(1, vr2.width());
				assert_equal(-37, vr2.min_y());
				assert_equal(1, vr2.height());
			}